

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

int __thiscall
IDisk::AddByteToSpecificTrack(IDisk *this,int side,uint track,uint index,uchar byte,int size)

{
  MFMTrack *pMVar1;
  short sVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uchar buffer [16];
  byte local_38 [4];
  byte bStack_34;
  byte bStack_33;
  byte bStack_32;
  byte bStack_31;
  byte bStack_30;
  byte bStack_2f;
  byte bStack_2e;
  byte bStack_2d;
  byte bStack_2c;
  byte bStack_2b;
  byte bStack_2a;
  byte bStack_29;
  
  pMVar1 = this->side_[side].tracks;
  uVar5 = pMVar1[track].size;
  if (uVar5 <= size + index) {
    uVar5 = uVar5 - index;
    if ((int)uVar5 < 1) {
      iVar3 = 0;
    }
    else {
      if (index == 0) {
        auVar7._1_3_ = 0;
        auVar7[0] = byte;
        auVar7[4] = byte;
        auVar7._5_3_ = 0;
        auVar7[8] = byte;
        auVar7._9_3_ = 0;
        auVar7[0xc] = byte;
        auVar7._13_3_ = 0;
        auVar12 = auVar7 & _DAT_001a79e0;
        auVar7 = auVar7 & _DAT_001a79f0;
        auVar16._0_4_ = -(uint)((int)DAT_001a79f0 == auVar7._0_4_);
        auVar16._4_4_ = -(uint)(DAT_001a79f0._4_4_ == auVar7._4_4_);
        auVar16._8_4_ = -(uint)(DAT_001a79f0._8_4_ == auVar7._8_4_);
        auVar16._12_4_ = -(uint)(DAT_001a79f0._12_4_ == auVar7._12_4_);
        auVar14._0_4_ = -(uint)((int)DAT_001a79e0 == auVar12._0_4_);
        auVar14._4_4_ = -(uint)(DAT_001a79e0._4_4_ == auVar12._4_4_);
        auVar14._8_4_ = -(uint)(DAT_001a79e0._8_4_ == auVar12._8_4_);
        auVar14._12_4_ = -(uint)(DAT_001a79e0._12_4_ == auVar12._12_4_);
        auVar8._0_4_ = -(uint)(auVar7._0_4_ == 0);
        auVar8._4_4_ = -(uint)(auVar7._4_4_ == 0);
        auVar8._8_4_ = -(uint)(auVar7._8_4_ == 0);
        auVar8._12_4_ = -(uint)(auVar7._12_4_ == 0);
        auVar13._0_4_ = -(uint)(auVar12._0_4_ == 0);
        auVar13._4_4_ = -(uint)(auVar12._4_4_ == 0);
        auVar13._8_4_ = -(uint)(auVar12._8_4_ == 0);
        auVar13._12_4_ = -(uint)(auVar12._12_4_ == 0);
        auVar7 = packssdw(auVar13,auVar8);
        auVar12._0_8_ = auVar7._0_8_ << 0x10;
        auVar12._8_8_ = auVar7._8_8_ << 0x10 | auVar7._0_8_ >> 0x30;
        auVar7 = (auVar12 | _DAT_001a7a10) & auVar7 & _DAT_001a79d0;
        auVar14 = packssdw(auVar14,auVar16);
        sVar2 = auVar7._0_2_;
        local_38[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar7[0] - (0xff < sVar2);
        sVar2 = auVar7._2_2_;
        local_38[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar7[2] - (0xff < sVar2);
        sVar2 = auVar7._4_2_;
        bStack_34 = (0 < sVar2) * (sVar2 < 0x100) * auVar7[4] - (0xff < sVar2);
        sVar2 = auVar7._6_2_;
        bStack_32 = (0 < sVar2) * (sVar2 < 0x100) * auVar7[6] - (0xff < sVar2);
        sVar2 = auVar7._8_2_;
        bStack_30 = (0 < sVar2) * (sVar2 < 0x100) * auVar7[8] - (0xff < sVar2);
        sVar2 = auVar7._10_2_;
        bStack_2e = (0 < sVar2) * (sVar2 < 0x100) * auVar7[10] - (0xff < sVar2);
        sVar2 = auVar7._12_2_;
        bStack_2c = (0 < sVar2) * (sVar2 < 0x100) * auVar7[0xc] - (0xff < sVar2);
        sVar2 = auVar7._14_2_;
        bStack_2a = (0 < sVar2) * (sVar2 < 0x100) * auVar7[0xe] - (0xff < sVar2);
        auVar14 = packsswb(auVar14,auVar14);
        bStack_29 = auVar14[7];
        bStack_2b = auVar14[6];
        bStack_2d = auVar14[5];
        bStack_2f = auVar14[4];
        bStack_31 = auVar14[3];
        bStack_33 = auVar14[2];
        local_38[3] = auVar14[1];
        local_38[1] = auVar14[0];
        puVar4 = pMVar1[track].bitfield;
      }
      else {
        puVar4 = pMVar1[track].bitfield;
        auVar9._1_3_ = 0;
        auVar9[0] = byte;
        auVar9[4] = byte;
        auVar9._5_3_ = 0;
        auVar9[8] = byte;
        auVar9._9_3_ = 0;
        auVar9[0xc] = byte;
        auVar9._13_3_ = 0;
        auVar14 = auVar9 & _DAT_001a79e0;
        auVar9 = auVar9 & _DAT_001a79f0;
        auVar17._0_4_ = -(uint)((int)DAT_001a79f0 == auVar9._0_4_);
        auVar17._4_4_ = -(uint)(DAT_001a79f0._4_4_ == auVar9._4_4_);
        auVar17._8_4_ = -(uint)(DAT_001a79f0._8_4_ == auVar9._8_4_);
        auVar17._12_4_ = -(uint)(DAT_001a79f0._12_4_ == auVar9._12_4_);
        auVar6._0_4_ = -(uint)((int)DAT_001a79e0 == auVar14._0_4_);
        auVar6._4_4_ = -(uint)(DAT_001a79e0._4_4_ == auVar14._4_4_);
        auVar6._8_4_ = -(uint)(DAT_001a79e0._8_4_ == auVar14._8_4_);
        auVar6._12_4_ = -(uint)(DAT_001a79e0._12_4_ == auVar14._12_4_);
        auVar7 = packssdw(auVar6,auVar17);
        auVar10._0_4_ = -(uint)(auVar9._0_4_ == 0);
        auVar10._4_4_ = -(uint)(auVar9._4_4_ == 0);
        auVar10._8_4_ = -(uint)(auVar9._8_4_ == 0);
        auVar10._12_4_ = -(uint)(auVar9._12_4_ == 0);
        auVar15._0_4_ = -(uint)(auVar14._0_4_ == 0);
        auVar15._4_4_ = -(uint)(auVar14._4_4_ == 0);
        auVar15._8_4_ = -(uint)(auVar14._8_4_ == 0);
        auVar15._12_4_ = -(uint)(auVar14._12_4_ == 0);
        auVar14 = packssdw(auVar15,auVar10);
        auVar11._0_8_ = auVar14._0_8_ << 0x10;
        auVar11._8_8_ = auVar14._8_8_ << 0x10 | auVar14._0_8_ >> 0x30;
        auVar14 = (ZEXT116(puVar4[index - 1] == '\0') | auVar11) & auVar14 & _DAT_001a79d0;
        sVar2 = auVar14._0_2_;
        local_38[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar14[0] - (0xff < sVar2);
        sVar2 = auVar14._2_2_;
        local_38[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar14[2] - (0xff < sVar2);
        sVar2 = auVar14._4_2_;
        bStack_34 = (0 < sVar2) * (sVar2 < 0x100) * auVar14[4] - (0xff < sVar2);
        sVar2 = auVar14._6_2_;
        bStack_32 = (0 < sVar2) * (sVar2 < 0x100) * auVar14[6] - (0xff < sVar2);
        sVar2 = auVar14._8_2_;
        bStack_30 = (0 < sVar2) * (sVar2 < 0x100) * auVar14[8] - (0xff < sVar2);
        sVar2 = auVar14._10_2_;
        bStack_2e = (0 < sVar2) * (sVar2 < 0x100) * auVar14[10] - (0xff < sVar2);
        sVar2 = auVar14._12_2_;
        bStack_2c = (0 < sVar2) * (sVar2 < 0x100) * auVar14[0xc] - (0xff < sVar2);
        sVar2 = auVar14._14_2_;
        bStack_2a = (0 < sVar2) * (sVar2 < 0x100) * auVar14[0xe] - (0xff < sVar2);
        auVar14 = packsswb(auVar7,auVar7);
        bStack_29 = auVar14[7];
        bStack_2b = auVar14[6];
        bStack_2d = auVar14[5];
        bStack_2f = auVar14[4];
        bStack_31 = auVar14[3];
        bStack_33 = auVar14[2];
        local_38[3] = auVar14[1];
        local_38[1] = auVar14[0];
      }
      bStack_29 = bStack_29 & 1;
      bStack_2a = bStack_2a & 1;
      bStack_2b = bStack_2b & 1;
      bStack_2c = bStack_2c & 1;
      bStack_2d = bStack_2d & 1;
      bStack_2e = bStack_2e & 1;
      bStack_2f = bStack_2f & 1;
      bStack_30 = bStack_30 & 1;
      bStack_31 = bStack_31 & 1;
      bStack_32 = bStack_32 & 1;
      bStack_33 = bStack_33 & 1;
      bStack_34 = bStack_34 & 1;
      local_38[3] = local_38[3] & 1;
      local_38[2] = local_38[2] & 1;
      local_38[1] = local_38[1] & 1;
      local_38[0] = local_38[0] & 1;
      memcpy(puVar4 + index,local_38,(ulong)uVar5);
      iVar3 = size - uVar5;
      memcpy(this->side_[side].tracks[track].bitfield,local_38 + uVar5,(long)iVar3);
    }
    return iVar3;
  }
  iVar3 = AddByteToTrackInBits(pMVar1[track].bitfield,index,byte,size,uVar5);
  return iVar3;
}

Assistant:

int IDisk::AddByteToSpecificTrack(int side, unsigned int track, unsigned int index, unsigned char byte, int size)
{
   if (index + size >= side_[side].tracks[track].size)
   {
      unsigned char buffer[16];

      const int nb_byte_to_last_track = side_[side].tracks[track].size - index;

      if (nb_byte_to_last_track > 0)
      {
         // Index should be far more than 0 ! Otherwiser, track is about 16 bit long ??
         if (index > 0)
         {
            AddByteToTrack(buffer, 0, byte, 8, side_[side].tracks[track].bitfield[index - 1]);
         }
         else
         {
            AddByteToTrack(buffer, 0, byte, 8, 0);
         }
         memcpy(&side_[side].tracks[track].bitfield[index], buffer, nb_byte_to_last_track);

         // Copy remaining to begining of the track ?
         memcpy(&side_[side].tracks[track].bitfield[0], &buffer[nb_byte_to_last_track], size - nb_byte_to_last_track);
         return (size) - nb_byte_to_last_track;
      }
      // TODO !
      return 0;
   }
   return AddByteToTrackInBits(side_[side].tracks[track].bitfield, index, byte, size, side_[side].tracks[track].size);
}